

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_127a7::TestCheckArray2DCloseTrue::RunImpl(TestCheckArray2DCloseTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  float local_c8;
  int local_c4;
  TestDetails local_c0;
  TestResults results;
  float array2 [3] [3];
  float array1 [3] [3];
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  array1[1][1] = 2.5;
  array1[1][2] = 3.0;
  array1[2][0] = 3.0;
  array1[2][1] = 3.5;
  array1[0][0] = 1.0;
  array1[0][1] = 1.5;
  array1[0][2] = 2.0;
  array1[1][0] = 2.0;
  array1[2][2] = 4.0;
  array2[1][1] = 2.51;
  array2[1][2] = 3.01;
  array2[2][0] = 3.01;
  array2[2][1] = 3.51;
  array2[0][0] = 1.01;
  array2[0][1] = 1.51;
  array2[0][2] = 2.01;
  array2[1][0] = 2.01;
  array2[2][2] = 4.01;
  local_c8 = 0.02;
  UnitTest::TestDetails::TestDetails(&local_c0,"","","",0);
  UnitTest::CheckArray2DClose<float[3][3],float[3][3],float>
            (&results,&array1,&array2,3,3,&local_c8,&local_c0);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_c8 = 0.0;
  local_c4 = UnitTest::TestResults::GetFailureCount(&results);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_c0,*ppTVar2,0xfb);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&local_c8,&local_c4,&local_c0);
  return;
}

Assistant:

TEST(CheckArray2DCloseTrue)
{
    TestResults results;

    float const array1[3][3] = { { 1.0f, 1.5f, 2.0f },
                                 { 2.0f, 2.5f, 3.0f },
                                 { 3.0f, 3.5f, 4.0f } };
    float const array2[3][3] = { { 1.01f, 1.51f, 2.01f },
                                 { 2.01f, 2.51f, 3.01f },
                                 { 3.01f, 3.51f, 4.01f } };
    CheckArray2DClose(results, array1, array2, 3, 3, 0.02f, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}